

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O2

void ywalg2(double *x,int N,int p,double *phi,double *var)

{
  size_t sVar1;
  int iVar2;
  double *acov;
  double *B;
  void *__ptr;
  double *A;
  double *C;
  ulong uVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  
  sVar1 = (long)p * 8 + 8;
  acov = (double *)malloc(sVar1);
  B = (double *)malloc(sVar1);
  sVar1 = (long)p * 8;
  __ptr = malloc(sVar1);
  A = (double *)malloc(sVar1);
  C = (double *)malloc(8);
  autocovar(x,N,acov,p + 1);
  dVar11 = *acov;
  *var = dVar11;
  *acov = 1.0;
  uVar3 = 0;
  uVar8 = 0;
  if (0 < p) {
    uVar8 = (ulong)(uint)p;
  }
  for (; uVar8 != uVar3; uVar3 = uVar3 + 1) {
    acov[uVar3 + 1] = acov[uVar3 + 1] / dVar11;
  }
  dVar11 = -acov[1];
  iVar2 = 1;
  if (1 < p) {
    iVar2 = p;
  }
  *B = dVar11;
  dVar12 = 1.0;
  lVar10 = 1;
  lVar9 = 0;
  uVar3 = 0;
  while (uVar3 != iVar2 - 1) {
    pdVar4 = A;
    for (uVar6 = uVar3; -1 < (long)uVar6; uVar6 = uVar6 - 1) {
      *pdVar4 = (acov + 1)[uVar6];
      pdVar4 = pdVar4 + 1;
    }
    dVar12 = dVar12 * (1.0 - dVar11 * dVar11);
    uVar6 = uVar3 + 1;
    mmult(A,B,C,1,(int)uVar6,1);
    dVar11 = -(*C + acov[uVar3 + 2]) / dVar12;
    lVar5 = lVar9;
    for (lVar7 = 0; lVar10 != lVar7; lVar7 = lVar7 + 1) {
      *(double *)((long)__ptr + lVar7 * 8) = *(double *)((long)B + lVar5) * dVar11 + B[lVar7];
      lVar5 = lVar5 + -8;
    }
    for (lVar5 = 0; lVar10 != lVar5; lVar5 = lVar5 + 1) {
      B[lVar5] = *(double *)((long)__ptr + lVar5 * 8);
    }
    B[uVar6] = dVar11;
    lVar10 = lVar10 + 1;
    lVar9 = lVar9 + 8;
    uVar3 = uVar6;
  }
  for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
    phi[uVar3] = -B[uVar3];
  }
  mmult(acov + 1,phi,C,1,p,1);
  *var = (1.0 - *C) * *var;
  free(acov);
  free(__ptr);
  free(B);
  free(A);
  free(C);
  return;
}

Assistant:

void ywalg2(double *x, int N, int p, double *phi,double *var) {
	int lag, k, j;
	double *acf, *z, *y, *temp1, *temp2;
	double a, b;
	// Same as ywalg except it also returns the variance value
	lag = p + 1;
	acf = (double*)malloc(sizeof(double)* lag);
	y = (double*)malloc(sizeof(double)* lag);
	z = (double*)malloc(sizeof(double)* p);
	temp1 = (double*)malloc(sizeof(double)* p);
	temp2 = (double*)malloc(sizeof(double)* 1);

	autocovar(x, N, acf, lag);
	*var = acf[0];
	acf[0] = 1.0;
	for (k = 1; k < lag; ++k) {
		acf[k] = acf[k] / *var;
	}
	b = acf[0];
	a = y[0] = -acf[1];

	for (k = 0; k < p - 1; ++k) {
		b = (1 - a*a) * b;
		for (j = k; j >= 0; --j) {
			temp1[k - j] = acf[j + 1];
		}
		mmult(temp1, y, temp2, 1, k + 1, 1);

		a = -(*temp2 + acf[k + 2]) / b;

		for (j = 0; j <= k; ++j) {
			z[j] = y[j] + a * y[k - j];
		}

		for (j = 0; j <= k; ++j) {
			y[j] = z[j];
		}
		y[k + 1] = a;

	}

	for (j = 0; j < p; ++j) {
		phi[j] = -1.0 * y[j];
	}
	mmult(acf + 1, phi, temp2, 1, p, 1);
	*var = *var * (1.0 - *temp2);

	free(acf);
	free(z);
	free(y);
	free(temp1);
	free(temp2);
}